

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandReadBlifMv(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  uint fCheck;
  
  Extra_UtilGetoptReset();
  fCheck = 1;
  while (iVar1 = Extra_UtilGetopt(argc,argv,"ch"), iVar1 == 99) {
    fCheck = fCheck ^ 1;
  }
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    pNtk = Io_Read(argv[globalUtilOptind],IO_FILE_BLIFMV,fCheck,0);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
      Abc_FrameClearVerifStatus(pAbc);
      return 0;
    }
  }
  else {
    fwrite("usage: read_blif_mv [-ch] <file>\n",0x21,1,(FILE *)pAbc->Err);
    fwrite("\t         reads the network in BLIF-MV format\n",0x2e,1,(FILE *)pAbc->Err);
    fwrite("\t         (if this command does not work, try \"read\")\n",0x36,1,(FILE *)pAbc->Err);
    pcVar2 = "yes";
    if (fCheck == 0) {
      pcVar2 = "no";
    }
    fprintf((FILE *)pAbc->Err,"\t-c     : toggle network check after reading [default = %s]\n",
            pcVar2);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  }
  return 1;
}

Assistant:

int IoCommandReadBlifMv( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pFileName;
    int fCheck;
    int c;

    fCheck = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pFileName = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    pNtk = Io_Read( pFileName, IO_FILE_BLIFMV, fCheck, 0 );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_blif_mv [-ch] <file>\n" );
    fprintf( pAbc->Err, "\t         reads the network in BLIF-MV format\n" );
    fprintf( pAbc->Err, "\t         (if this command does not work, try \"read\")\n" );
    fprintf( pAbc->Err, "\t-c     : toggle network check after reading [default = %s]\n", fCheck? "yes":"no" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}